

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPostDepthCoverageTests.cpp
# Opt level: O1

IterateResult __thiscall gl4cts::PostDepthShaderCase::iterate(PostDepthShaderCase *this)

{
  string *__x;
  ostringstream *poVar1;
  TestContext *this_00;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  ShaderProgram program4;
  ShaderProgram program3;
  ShaderProgram program2;
  ShaderProgram program1;
  ProgramSources sources1;
  ProgramSources sources4;
  ProgramSources sources3;
  ProgramSources sources2;
  undefined1 local_820 [120];
  ios_base local_7a8 [264];
  ShaderProgram local_6a0;
  ShaderProgram local_5d0;
  ShaderProgram local_500;
  ShaderProgram local_430;
  ProgramSources local_360;
  ProgramSources local_290;
  ProgramSources local_1c0;
  ProgramSources local_f0;
  Functions *gl;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar2);
  __x = &this->m_vertShader;
  local_360.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_360._193_8_ = 0;
  local_360.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_360.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_360.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  memset(&local_360,0,0xac);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_360.sources,__x);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_360.sources + 1,&this->m_fragShader1);
  glu::ShaderProgram::ShaderProgram(&local_430,gl,&local_360);
  if (local_430.m_program.m_info.linkOk == false) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Fail checking extension in shader");
    local_820._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_820 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Vertex: ",8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               ((*local_430.m_shaders[0].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->m_info).infoLog._M_dataplus._M_p,
               ((*local_430.m_shaders[0].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->m_info).infoLog._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Fragment: ",10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,
               ((*local_430.m_shaders[1].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->m_info).infoLog._M_dataplus._M_p,
               ((*local_430.m_shaders[1].
                  super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->m_info).infoLog._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Program: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,local_430.m_program.m_info.infoLog._M_dataplus._M_p,
               local_430.m_program.m_info.infoLog._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_820,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_7a8);
  }
  else {
    local_f0.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    local_f0._193_8_ = 0;
    local_f0.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_f0.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    local_f0.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    memset(&local_f0,0,0xac);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_f0.sources,__x);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(local_f0.sources + 1,&this->m_fragShader2);
    glu::ShaderProgram::ShaderProgram(&local_500,gl,&local_f0);
    if (local_500.m_program.m_info.linkOk == false) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail checking preprocessor directives in shader");
      local_820._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_820 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Vertex: ",8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 ((*local_500.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start)->m_info).infoLog._M_dataplus._M_p,
                 ((*local_500.m_shaders[0].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start)->m_info).infoLog._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Fragment: ",10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,
                 ((*local_500.m_shaders[1].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start)->m_info).infoLog._M_dataplus._M_p,
                 ((*local_500.m_shaders[1].
                    super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                    super__Vector_impl_data._M_start)->m_info).infoLog._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Program: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_500.m_program.m_info.infoLog._M_dataplus._M_p,
                 local_500.m_program.m_info.infoLog._M_string_length);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_820,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_7a8);
    }
    else {
      local_1c0.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
      local_1c0._193_8_ = 0;
      local_1c0.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1c0.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
      local_1c0.transformFeedbackVaryings.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
      memset(&local_1c0,0,0xac);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_1c0.sources,__x);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(local_1c0.sources + 1,&this->m_fragShader3);
      glu::ShaderProgram::ShaderProgram(&local_5d0,gl,&local_1c0);
      if (local_5d0.m_program.m_info.linkOk == false) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail checking first layout setup in shader");
        local_820._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        poVar1 = (ostringstream *)(local_820 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Vertex: ",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   ((*local_5d0.m_shaders[0].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_start)->m_info).infoLog._M_dataplus._M_p,
                   ((*local_5d0.m_shaders[0].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_start)->m_info).infoLog._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Fragment: ",10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,
                   ((*local_5d0.m_shaders[1].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_start)->m_info).infoLog._M_dataplus._M_p,
                   ((*local_5d0.m_shaders[1].
                      super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                      super__Vector_impl_data._M_start)->m_info).infoLog._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Program: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,local_5d0.m_program.m_info.infoLog._M_dataplus._M_p,
                   local_5d0.m_program.m_info.infoLog._M_string_length);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_820,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_7a8);
      }
      else {
        local_290.transformFeedbackVaryings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
        local_290._193_8_ = 0;
        local_290.transformFeedbackVaryings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_290.transformFeedbackVaryings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
        local_290.transformFeedbackVaryings.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
        memset(&local_290,0,0xac);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_290.sources,__x);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_290.sources + 1,&this->m_fragShader4);
        glu::ShaderProgram::ShaderProgram(&local_6a0,gl,&local_290);
        this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
        if (local_6a0.m_program.m_info.linkOk == false) {
          tcu::TestContext::setTestResult
                    (this_00,QP_TEST_RESULT_FAIL,"Fail checking second layout setup in shader");
          local_820._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          poVar1 = (ostringstream *)(local_820 + 8);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Vertex: ",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     ((*local_6a0.m_shaders[0].
                        super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                        super__Vector_impl_data._M_start)->m_info).infoLog._M_dataplus._M_p,
                     ((*local_6a0.m_shaders[0].
                        super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                        super__Vector_impl_data._M_start)->m_info).infoLog._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Fragment: ",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,
                     ((*local_6a0.m_shaders[1].
                        super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                        super__Vector_impl_data._M_start)->m_info).infoLog._M_dataplus._M_p,
                     ((*local_6a0.m_shaders[1].
                        super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
                        super__Vector_impl_data._M_start)->m_info).infoLog._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Program: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,local_6a0.m_program.m_info.infoLog._M_dataplus._M_p,
                     local_6a0.m_program.m_info.infoLog._M_string_length);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_820,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_7a8);
        }
        else {
          tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,"Pass");
        }
        glu::ShaderProgram::~ShaderProgram(&local_6a0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_290.transformFeedbackVaryings);
        std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::
        ~vector(&local_290.attribLocationBindings);
        lVar3 = 0x78;
        do {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&local_290.sources[0].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar3));
          lVar3 = lVar3 + -0x18;
        } while (lVar3 != -0x18);
      }
      glu::ShaderProgram::~ShaderProgram(&local_5d0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1c0.transformFeedbackVaryings);
      std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
                (&local_1c0.attribLocationBindings);
      lVar3 = 0x78;
      do {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&local_1c0.sources[0].
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
    }
    glu::ShaderProgram::~ShaderProgram(&local_500);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f0.transformFeedbackVaryings);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_f0.attribLocationBindings);
    lVar3 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&local_f0.sources[0].
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + lVar3));
      lVar3 = lVar3 + -0x18;
    } while (lVar3 != -0x18);
  }
  glu::ShaderProgram::~ShaderProgram(&local_430);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_360.transformFeedbackVaryings);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_360.attribLocationBindings);
  lVar3 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_360.sources[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar3));
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != -0x18);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult PostDepthShaderCase::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

	ProgramSources sources1 = makeVtxFragSources(m_vertShader, m_fragShader1);
	ShaderProgram  program1(gl, sources1);

	if (!program1.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail checking extension in shader");
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex: " << program1.getShaderInfo(SHADERTYPE_VERTEX).infoLog
						   << "\n"
						   << "Fragment: " << program1.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program1.getProgramInfo().infoLog << tcu::TestLog::EndMessage;

		return STOP;
	}

	ProgramSources sources2 = makeVtxFragSources(m_vertShader, m_fragShader2);
	ShaderProgram  program2(gl, sources2);

	if (!program2.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail checking preprocessor directives in shader");
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex: " << program2.getShaderInfo(SHADERTYPE_VERTEX).infoLog
						   << "\n"
						   << "Fragment: " << program2.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program2.getProgramInfo().infoLog << tcu::TestLog::EndMessage;
		return STOP;
	}

	ProgramSources sources3 = makeVtxFragSources(m_vertShader, m_fragShader3);
	ShaderProgram  program3(gl, sources3);

	if (!program3.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail checking first layout setup in shader");
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex: " << program3.getShaderInfo(SHADERTYPE_VERTEX).infoLog
						   << "\n"
						   << "Fragment: " << program3.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program3.getProgramInfo().infoLog << tcu::TestLog::EndMessage;
		return STOP;
	}

	ProgramSources sources4 = makeVtxFragSources(m_vertShader, m_fragShader4);
	ShaderProgram  program4(gl, sources4);

	if (!program4.isOk())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail checking second layout setup in shader");
		m_testCtx.getLog() << tcu::TestLog::Message << "Vertex: " << program4.getShaderInfo(SHADERTYPE_VERTEX).infoLog
						   << "\n"
						   << "Fragment: " << program4.getShaderInfo(SHADERTYPE_FRAGMENT).infoLog << "\n"
						   << "Program: " << program4.getProgramInfo().infoLog << tcu::TestLog::EndMessage;
		return STOP;
	}

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}